

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_manager.cpp
# Opt level: O1

void __thiscall cfd::core::CfdCoreManager::~CfdCoreManager(CfdCoreManager *this)

{
  ~CfdCoreManager(this);
  operator_delete(this);
  return;
}

Assistant:

CfdCoreManager::~CfdCoreManager() {
  if (!handle_list_.empty()) {
    for (CfdCoreHandle handle : handle_list_) {
      Finalize(handle, true);
    }
  }
}